

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertTransformOrder_TRStoSRT
          (FBXConverter *this,aiQuatKey *out_quat,aiVectorKey *out_scale,
          aiVectorKey *out_translation,KeyFrameListList *scaling,KeyFrameListList *translation,
          KeyFrameListList *rotation,KeyTimeList *times,double *maxTime,double *minTime,
          RotOrder order,aiVector3D *def_scale,aiVector3D *def_translate,aiVector3D *def_rotation)

{
  pointer plVar1;
  float fVar2;
  aiVector3D *paVar3;
  ulong uVar4;
  aiVector3t<float> *pPosition;
  ulong uVar5;
  aiQuaterniont<float> *this_00;
  float *pfVar6;
  FBXConverter *this_01;
  bool bVar7;
  aiQuaternion aVar8;
  aiVector3t<float> *local_140;
  aiMatrix3x3t<float> local_118;
  aiMatrix3x3t<float> local_f0;
  float fStack_cc;
  float local_c8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined4 local_b4;
  aiMatrix4x4t<float> local_b0;
  aiMatrix4x4t<float> local_70;
  
  if ((rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pfVar6 = &(out_quat->mValue).y;
    this_01 = (FBXConverter *)minTime;
    for (uVar4 = 0;
        plVar1 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)plVar1 >> 3);
        uVar4 = uVar4 + 1) {
      *(double *)(pfVar6 + -4) = ((double)plVar1[uVar4] / 46186158000.0) * this->anim_fps;
      aVar8 = EulerToQuaternion(this_01,def_rotation,order);
      *(aiQuaternion *)(pfVar6 + -2) = aVar8;
      pfVar6 = pfVar6 + 6;
    }
  }
  else {
    InterpolateKeys(this,out_quat,times,rotation,def_rotation,maxTime,minTime,order);
  }
  if ((scaling->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (scaling->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    paVar3 = &out_scale->mValue;
    for (uVar4 = 0;
        plVar1 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)plVar1 >> 3);
        uVar4 = uVar4 + 1) {
      *(double *)((long)(paVar3 + -1) + 4) =
           ((double)plVar1[uVar4] / 46186158000.0) * this->anim_fps;
      fVar2 = def_scale->y;
      paVar3->x = def_scale->x;
      paVar3->y = fVar2;
      paVar3->z = def_scale->z;
      paVar3 = paVar3 + 2;
    }
  }
  else {
    InterpolateKeys(this,out_scale,times,scaling,def_scale,maxTime,minTime);
  }
  if ((translation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (translation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    paVar3 = &out_translation->mValue;
    uVar4 = 0;
    while( true ) {
      plVar1 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
      if (uVar5 <= uVar4) break;
      *(double *)((long)(paVar3 + -1) + 4) =
           ((double)plVar1[uVar4] / 46186158000.0) * this->anim_fps;
      fVar2 = def_translate->y;
      paVar3->x = def_translate->x;
      paVar3->y = fVar2;
      paVar3->z = def_translate->z;
      uVar4 = uVar4 + 1;
      paVar3 = paVar3 + 2;
    }
  }
  else {
    InterpolateKeys(this,out_translation,times,translation,def_translate,maxTime,minTime);
    uVar5 = (long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  pPosition = &out_translation->mValue;
  local_140 = &out_scale->mValue;
  this_00 = &out_quat->mValue;
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
    local_b0.a1 = 1.0;
    local_b0.a2 = 0.0;
    local_b0.a3 = 0.0;
    local_b0.a4 = 0.0;
    local_b0.b1 = 0.0;
    local_b0.b2 = 1.0;
    local_b0.b3 = 0.0;
    local_b0.b4 = 0.0;
    local_b0.c1 = 0.0;
    local_b0.c2 = 0.0;
    local_b0.c3 = 1.0;
    local_70.a1 = 1.0;
    local_70.a2 = 0.0;
    local_70.a3 = 0.0;
    local_70.b2 = 1.0;
    local_70.c1 = 0.0;
    local_70.c2 = 0.0;
    local_70.c3 = 1.0;
    local_70.d3 = 0.0;
    local_b0.c4 = 0.0;
    local_b0.d1 = 0.0;
    local_b0.d2 = 0.0;
    local_b0.d3 = 0.0;
    local_70.d1 = 0.0;
    local_70.d2 = 0.0;
    local_b0.d4 = 1.0;
    local_70.d4 = 1.0;
    local_70.b1 = 0.0;
    local_70.a4 = pPosition->x;
    local_70._24_8_ = (ulong)(uint)pPosition->y << 0x20;
    local_70.c4 = pPosition->z;
    aiQuaterniont<float>::GetMatrix(&local_118,this_00);
    local_f0.a1 = local_118.a1;
    local_f0.a2 = local_118.a2;
    local_f0.a3 = local_118.a3;
    local_f0.b1 = 0.0;
    local_f0.b2 = local_118.b1;
    local_f0.b3 = local_118.b2;
    local_f0.c1 = local_118.b3;
    local_f0.c2 = 0.0;
    local_f0.c3 = local_118.c1;
    fStack_cc = local_118.c2;
    local_c8 = local_118.c3;
    local_c4 = 0;
    uStack_bc = 0;
    local_b4 = 0x3f800000;
    aiMatrix4x4t<float>::operator*=(&local_70,(aiMatrix4x4t<float> *)&local_f0);
    local_b0.a2 = 0.0;
    local_b0.a3 = 0.0;
    local_b0.a4 = 0.0;
    local_b0.b1 = 0.0;
    local_b0.b3 = 0.0;
    local_b0.b4 = 0.0;
    local_b0.c1 = 0.0;
    local_b0.c2 = 0.0;
    local_b0.c4 = 0.0;
    local_b0.d1 = 0.0;
    local_b0.d2 = 0.0;
    local_b0.d3 = 0.0;
    local_b0.d4 = 1.0;
    local_b0.a1 = local_140->x;
    local_b0.b2 = local_140->y;
    local_b0.c3 = local_140->z;
    aiMatrix4x4t<float>::operator*=(&local_70,&local_b0);
    aiMatrix4x4t<float>::Decompose(&local_70,local_140,this_00,pPosition);
    pPosition = pPosition + 2;
    local_140 = local_140 + 2;
    this_00 = (aiQuaterniont<float> *)&this_00[1].y;
  }
  return;
}

Assistant:

void FBXConverter::ConvertTransformOrder_TRStoSRT(aiQuatKey* out_quat, aiVectorKey* out_scale,
            aiVectorKey* out_translation,
            const KeyFrameListList& scaling,
            const KeyFrameListList& translation,
            const KeyFrameListList& rotation,
            const KeyTimeList& times,
            double& maxTime,
            double& minTime,
            Model::RotOrder order,
            const aiVector3D& def_scale,
            const aiVector3D& def_translate,
            const aiVector3D& def_rotation)
        {
            if (rotation.size()) {
                InterpolateKeys(out_quat, times, rotation, def_rotation, maxTime, minTime, order);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_quat[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_quat[i].mValue = EulerToQuaternion(def_rotation, order);
                }
            }

            if (scaling.size()) {
                InterpolateKeys(out_scale, times, scaling, def_scale, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_scale[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_scale[i].mValue = def_scale;
                }
            }

            if (translation.size()) {
                InterpolateKeys(out_translation, times, translation, def_translate, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_translation[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_translation[i].mValue = def_translate;
                }
            }

            const size_t count = times.size();
            for (size_t i = 0; i < count; ++i) {
                aiQuaternion& r = out_quat[i].mValue;
                aiVector3D& s = out_scale[i].mValue;
                aiVector3D& t = out_translation[i].mValue;

                aiMatrix4x4 mat, temp;
                aiMatrix4x4::Translation(t, mat);
                mat *= aiMatrix4x4(r.GetMatrix());
                mat *= aiMatrix4x4::Scaling(s, temp);

                mat.Decompose(s, r, t);
            }
        }